

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall smf::Option_register::reset(Option_register *this)

{
  Option_register *this_local;
  
  this->m_type = 's';
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  return;
}

Assistant:

void Option_register::reset(void) {
	m_type = OPTION_TYPE_string;
	m_definition.clear();
	m_defaultOption.clear();
	m_modifiedOption.clear();
}